

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O2

float trainIterate(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
                  tensor_t<float> *train_tensor,tensor_t<float> *expected_output)

{
  layer_type lVar1;
  pointer pplVar2;
  fc_layer_t *this;
  undefined1 auVar3 [16];
  uint uVar4;
  tensor_t<float> *ptVar5;
  layer_t *layer;
  int i;
  ulong uVar6;
  long lVar7;
  pointer pplVar8;
  float fVar9;
  undefined1 auVar10 [16];
  tensor_t<float> grads;
  
  uVar6 = 0;
  while( true ) {
    pplVar8 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pplVar2 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)pplVar2 - (long)pplVar8 >> 3) <= uVar6) break;
    if (uVar6 == 0) {
      layer = *pplVar8;
      ptVar5 = train_tensor;
    }
    else {
      layer = pplVar8[uVar6];
      ptVar5 = &pplVar8[uVar6 - 1]->out;
    }
    activate(layer,ptVar5);
    uVar6 = uVar6 + 1;
  }
  tensor_t<float>::operator-(&grads,&pplVar2[-1]->out,expected_output);
  for (lVar7 = (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3; 0 < lVar7; lVar7 = lVar7 + -1) {
    pplVar8 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ptVar5 = &grads;
    if (lVar7 != (long)(layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pplVar8 >> 3) {
      ptVar5 = &pplVar8[lVar7]->grads_in;
    }
    calc_grads(pplVar8[lVar7 + -1],ptVar5);
  }
  pplVar8 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pplVar2 = (layers->super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (pplVar8 == pplVar2) {
      uVar4 = grads.size.y * grads.size.x * grads.size.z;
      fVar9 = 0.0;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      for (uVar6 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar6; uVar6 = uVar6 + 1) {
        if (0.5 < (expected_output->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6]) {
          auVar3 = vandps_avx(ZEXT416((uint)grads.data.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar6]),auVar10
                             );
          fVar9 = auVar3._0_4_ + fVar9;
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&grads);
      return fVar9 * 100.0;
    }
    this = (fc_layer_t *)*pplVar8;
    lVar1 = (this->super_layer_t).type;
    if (1 < lVar1 - relu) {
      if (lVar1 == fc) {
        fc_layer_t::fix_weights(this);
      }
      else {
        if (lVar1 != conv) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/cnn.h"
                        ,0x2d,"void fix_weights(layer_t *)");
        }
        conv_layer_t::fix_weights((conv_layer_t *)this);
      }
    }
    pplVar8 = pplVar8 + 1;
  } while( true );
}

Assistant:

float trainIterate(std::vector<layer_t *> &layers, tensor_t<float> &train_tensor, tensor_t<float> &expected_output) {
  // Activate each layer with the training tensor as input
  for (int i = 0; i < layers.size(); i++) {
    if (i == 0)
      activate(layers[i], train_tensor);
    else
      activate(layers[i], layers[i - 1]->out);
  }

  // Check the difference with the label / expected output
  tensor_t<float> grads = layers.back()->out - expected_output;

  // Calculate the gradients
  for (ssize_t i = layers.size() - 1; i >= 0; i--) {
    if (i == layers.size() - 1)
      calc_grads(layers[i], grads);
    else
      calc_grads(layers[i], layers[i + 1]->grads_in);
  }

  // Potentially update the weights
  for (auto &layer : layers) {
    fix_weights(layer);
  }

  // Calculate the error
  float err = 0;
  for (int i = 0; i < grads.size.x * grads.size.y * grads.size.z; i++) {
    float f = expected_output.data[i];
    if (f > 0.5)
      err += abs(grads.data[i]);
  }
  return err * 100;
}